

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O3

string * __thiscall
m2d::savanna::endpoint::build_url_str_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  uint __val;
  uint uVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  uint __len;
  string __str;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (**this->_vptr_endpoint)(local_58);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_68 = *plVar7;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar7;
    local_78 = (long *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  (*this->_vptr_endpoint[1])(&local_78,this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  iVar2 = (*this->_vptr_endpoint[6])(this);
  if (iVar2 != 0x50) {
    uVar3 = (*this->_vptr_endpoint[6])(this);
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar8 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar6 = (uint)uVar8;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_00114a9b;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_00114a9b;
        }
        if (uVar6 < 10000) goto LAB_00114a9b;
        uVar8 = uVar8 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar6);
      __len = __len + 1;
    }
LAB_00114a9b:
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0] + (uVar3 >> 0x1f),__len,__val);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x1c1770);
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = puVar5[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*puVar5;
    }
    local_70 = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  (*this->_vptr_endpoint[5])(&local_78,this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string build_url_str()
		{
			std::string new_url;
			new_url += scheme() + "://";
			new_url += host();
			if (port() != 80) {
				new_url += ":" + std::to_string(port());
			}
			new_url += build_path();

			return new_url;
		}